

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int *piVar8;
  Allocator *pAVar9;
  int k;
  long lVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  undefined4 *puVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  int k_1;
  long lVar23;
  long lVar24;
  uint _w;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  void *pvVar32;
  void *pvVar33;
  long lVar34;
  int k_2;
  int iVar35;
  void *pvVar36;
  void *pvVar37;
  void *pvVar38;
  long lVar39;
  undefined4 *puVar40;
  void *pvVar41;
  undefined4 *puVar42;
  undefined4 *puVar43;
  uint uVar44;
  void *pvVar45;
  long local_b8;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar3 = (this->super_Convolution1D).kernel_w;
  lVar27 = (long)(int)uVar3;
  uVar19 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar3;
  uVar15 = (this->super_Convolution1D).num_output;
  lVar23 = (long)(int)uVar15;
  uVar19 = (long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
           (long)(int)uVar15;
  uVar30 = uVar19 & 0xffffffff;
  uVar44 = (uint)uVar19;
  uVar18 = uVar44;
  if (lVar23 < 4) {
    if ((int)uVar15 < 2) {
      if ((int)uVar44 < 4) {
        _w = uVar3;
        if (1 < (int)uVar44) {
          _w = uVar3 * 2;
          uVar18 = (uVar44 & 1) + 1;
        }
      }
      else {
        _w = uVar3 * 4;
        uVar18 = (uVar44 & 1) + (int)(uVar30 >> 2) + (uint)((uVar44 >> 1 & 1) != 0);
      }
    }
    else {
      if ((int)uVar44 < 4) {
        if ((int)uVar44 < 2) {
          _w = uVar3 * 2;
          uVar15 = (uVar15 & 1) + 1;
          goto LAB_004c7993;
        }
        _w = uVar3 * 4;
        uVar18 = (uVar44 & 1) + 1;
      }
      else {
        uVar18 = (uVar44 & 1) + (int)(uVar30 >> 2) + (uint)((uVar44 >> 1 & 1) != 0);
        _w = uVar3 * 8;
      }
      uVar15 = (uVar15 & 1) + 1;
    }
  }
  else {
    if ((int)uVar44 < 4) {
      if ((int)uVar44 < 2) {
        _w = uVar3 * 4;
        uVar15 = (uVar15 & 1) + (uVar15 >> 2) + (uint)((uVar15 >> 1 & 1) != 0);
        goto LAB_004c7993;
      }
      _w = uVar3 * 8;
      uVar18 = (uVar44 & 1) + 1;
    }
    else {
      _w = uVar3 << 4;
      uVar18 = (uVar44 & 1) + (int)(uVar30 >> 2) + (uint)((uVar44 >> 1 & 1) != 0);
    }
    uVar15 = (uVar15 & 1) + (uVar15 >> 2) + (uint)((uVar15 >> 1 & 1) != 0);
  }
LAB_004c7993:
  Mat::create(&this->weight_data_tm,_w,uVar18,uVar15,4,(Allocator *)0x0);
  pvVar4 = (this->super_Convolution1D).weight_data.data;
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  pvVar7 = (this->weight_data_tm).data;
  lVar10 = (long)(int)(uVar3 * 2);
  iVar26 = 0;
  uVar19 = 0;
  if (0 < (int)uVar3) {
    uVar19 = (ulong)uVar3;
  }
  iVar31 = uVar3 * uVar44;
  iVar25 = iVar31 * 4;
  lVar16 = (long)(int)(uVar3 * 4) * 4;
  lVar34 = lVar27 * 4;
  iVar35 = iVar31 * 2;
  iVar20 = iVar31 * 3;
  lVar1 = lVar10 * 4;
  lVar2 = uVar19 * 4;
  for (uVar30 = 0; (long)(uVar30 | 3) < lVar23; uVar30 = uVar30 + 4) {
    pvVar12 = (void *)((long)pvVar4 + (long)iVar26 * 4);
    pvVar33 = (void *)((long)pvVar4 + (long)iVar31 * 4);
    pvVar38 = (void *)((long)pvVar4 + (long)iVar35 * 4);
    pvVar45 = (void *)((long)pvVar4 + (long)iVar20 * 4);
    pvVar32 = (void *)((uVar30 >> 2) * sVar5 * sVar6 + (long)pvVar7);
    local_b8 = 0;
    pvVar21 = pvVar38;
    pvVar36 = pvVar45;
    pvVar37 = pvVar33;
    pvVar41 = pvVar12;
    for (uVar15 = 0; (int)(uVar15 | 3) < (int)uVar44; uVar15 = uVar15 + 4) {
      lVar29 = local_b8;
      for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
        lVar28 = lVar29;
        for (lVar17 = 0; (int)lVar17 != 0x40; lVar17 = lVar17 + 0x10) {
          *(undefined4 *)((long)pvVar32 + lVar17) = *(undefined4 *)((long)pvVar12 + lVar28);
          *(undefined4 *)((long)pvVar32 + lVar17 + 4) = *(undefined4 *)((long)pvVar33 + lVar28);
          *(undefined4 *)((long)pvVar32 + lVar17 + 8) = *(undefined4 *)((long)pvVar38 + lVar28);
          *(undefined4 *)((long)pvVar32 + lVar17 + 0xc) = *(undefined4 *)((long)pvVar45 + lVar28);
          lVar28 = lVar28 + lVar34;
        }
        lVar29 = lVar29 + 4;
        pvVar32 = (void *)((long)pvVar32 + lVar17);
      }
      local_b8 = local_b8 + lVar16;
      pvVar41 = (void *)((long)pvVar41 + lVar16);
      pvVar37 = (void *)((long)pvVar37 + lVar16);
      pvVar21 = (void *)((long)pvVar21 + lVar16);
      pvVar36 = (void *)((long)pvVar36 + lVar16);
    }
    for (; (int)(uVar15 | 1) < (int)uVar44; uVar15 = uVar15 + 2) {
      pvVar12 = pvVar36;
      pvVar33 = pvVar21;
      pvVar38 = pvVar41;
      pvVar45 = pvVar37;
      for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
        lVar28 = 0;
        for (lVar29 = 0; (int)lVar29 != 0x20; lVar29 = lVar29 + 0x10) {
          *(undefined4 *)((long)pvVar32 + lVar29) = *(undefined4 *)((long)pvVar38 + lVar28);
          *(undefined4 *)((long)pvVar32 + lVar29 + 4) = *(undefined4 *)((long)pvVar45 + lVar28);
          *(undefined4 *)((long)pvVar32 + lVar29 + 8) = *(undefined4 *)((long)pvVar33 + lVar28);
          *(undefined4 *)((long)pvVar32 + lVar29 + 0xc) = *(undefined4 *)((long)pvVar12 + lVar28);
          lVar28 = lVar28 + lVar34;
        }
        pvVar38 = (void *)((long)pvVar38 + 4);
        pvVar45 = (void *)((long)pvVar45 + 4);
        pvVar33 = (void *)((long)pvVar33 + 4);
        pvVar12 = (void *)((long)pvVar12 + 4);
        pvVar32 = (void *)((long)pvVar32 + lVar29);
      }
      pvVar41 = (void *)((long)pvVar41 + lVar1);
      pvVar37 = (void *)((long)pvVar37 + lVar1);
      pvVar21 = (void *)((long)pvVar21 + lVar1);
      pvVar36 = (void *)((long)pvVar36 + lVar1);
    }
    for (; (int)uVar15 < (int)uVar44; uVar15 = uVar15 + 1) {
      pvVar12 = pvVar32;
      for (lVar29 = 0; lVar2 != lVar29; lVar29 = lVar29 + 4) {
        *(undefined4 *)((long)pvVar32 + lVar29 * 4) = *(undefined4 *)((long)pvVar41 + lVar29);
        *(undefined4 *)((long)pvVar32 + lVar29 * 4 + 4) = *(undefined4 *)((long)pvVar37 + lVar29);
        *(undefined4 *)((long)pvVar32 + lVar29 * 4 + 8) = *(undefined4 *)((long)pvVar21 + lVar29);
        *(undefined4 *)((long)pvVar32 + lVar29 * 4 + 0xc) = *(undefined4 *)((long)pvVar36 + lVar29);
        pvVar12 = (void *)((long)pvVar12 + 0x10);
      }
      pvVar32 = pvVar12;
    }
    iVar26 = iVar26 + iVar25;
    iVar31 = iVar31 + iVar25;
    iVar35 = iVar35 + iVar25;
    iVar20 = iVar20 + iVar25;
  }
  pvVar4 = (this->super_Convolution1D).weight_data.data;
  pvVar7 = (this->weight_data_tm).data;
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  iVar20 = uVar3 * uVar44 * 2;
  for (; (long)(uVar30 | 1) < lVar23; uVar30 = uVar30 + 2) {
    lVar17 = (long)iVar31;
    lVar29 = (long)pvVar4 + lVar17 * 4 + (long)(int)(uVar3 * 3) * 4;
    lVar28 = (long)pvVar4 + lVar17 * 4 + lVar10 * 4;
    lVar22 = (long)pvVar4 + lVar17 * 4 + lVar27 * 4;
    pvVar12 = (void *)((long)pvVar4 + lVar17 * 4);
    lVar13 = (long)iVar26;
    lVar17 = (long)pvVar4 + lVar13 * 4 + (long)(int)(uVar3 * 3) * 4;
    lVar39 = (long)pvVar4 + lVar13 * 4 + lVar10 * 4;
    lVar24 = (long)pvVar4 + lVar13 * 4 + lVar27 * 4;
    pvVar33 = (void *)((long)pvVar4 + lVar13 * 4);
    puVar42 = (undefined4 *)
              ((ulong)(((uint)(uVar30 >> 2) & 0x3fffffff) + (uint)(((uint)uVar30 >> 1 & 1) != 0)) *
               sVar5 * sVar6 + (long)pvVar7);
    for (uVar15 = 0; (int)(uVar15 | 3) < (int)uVar44; uVar15 = uVar15 + 4) {
      puVar43 = puVar42;
      for (lVar13 = 0; lVar2 != lVar13; lVar13 = lVar13 + 4) {
        puVar42[lVar13 * 2] = *(undefined4 *)((long)pvVar33 + lVar13);
        puVar42[lVar13 * 2 + 1] = *(undefined4 *)(lVar24 + lVar13);
        puVar42[lVar13 * 2 + 2] = *(undefined4 *)(lVar39 + lVar13);
        puVar42[lVar13 * 2 + 3] = *(undefined4 *)(lVar17 + lVar13);
        puVar42[lVar13 * 2 + 4] = *(undefined4 *)((long)pvVar12 + lVar13);
        puVar42[lVar13 * 2 + 5] = *(undefined4 *)(lVar22 + lVar13);
        puVar42[lVar13 * 2 + 6] = *(undefined4 *)(lVar28 + lVar13);
        puVar42[lVar13 * 2 + 7] = *(undefined4 *)(lVar29 + lVar13);
        puVar43 = puVar43 + 8;
      }
      pvVar33 = (void *)((long)pvVar33 + lVar16);
      pvVar12 = (void *)((long)pvVar12 + lVar16);
      lVar29 = lVar29 + lVar16;
      lVar28 = lVar28 + lVar16;
      lVar22 = lVar22 + lVar16;
      lVar17 = lVar17 + lVar16;
      lVar39 = lVar39 + lVar16;
      lVar24 = lVar24 + lVar16;
      puVar42 = puVar43;
    }
    for (; (int)(uVar15 | 1) < (int)uVar44; uVar15 = uVar15 + 2) {
      pvVar38 = pvVar33;
      pvVar45 = pvVar12;
      for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
        lVar28 = 0;
        for (lVar29 = 0; (int)lVar29 != 0x10; lVar29 = lVar29 + 8) {
          *(undefined4 *)((long)puVar42 + lVar29) = *(undefined4 *)((long)pvVar38 + lVar28);
          *(undefined4 *)((long)puVar42 + lVar29 + 4) = *(undefined4 *)((long)pvVar45 + lVar28);
          lVar28 = lVar28 + lVar34;
        }
        puVar42 = (undefined4 *)((long)puVar42 + lVar29);
        pvVar38 = (void *)((long)pvVar38 + 4);
        pvVar45 = (void *)((long)pvVar45 + 4);
      }
      pvVar33 = (void *)((long)pvVar33 + lVar1);
      pvVar12 = (void *)((long)pvVar12 + lVar1);
    }
    for (; (int)uVar15 < (int)uVar44; uVar15 = uVar15 + 1) {
      for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        *puVar42 = *(undefined4 *)((long)pvVar33 + uVar11 * 4);
        puVar42[1] = *(undefined4 *)((long)pvVar12 + uVar11 * 4);
        puVar42 = puVar42 + 2;
      }
    }
    iVar26 = iVar26 + iVar20;
    iVar31 = iVar31 + iVar20;
  }
  pvVar4 = (this->super_Convolution1D).weight_data.data;
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  pvVar7 = (this->weight_data_tm).data;
  for (; (long)uVar30 < lVar23; uVar30 = uVar30 + 1) {
    lVar34 = (long)pvVar4 + (long)iVar26 * 4 + lVar27 * 4;
    puVar42 = (undefined4 *)((long)pvVar4 + (long)iVar26 * 4);
    puVar43 = (undefined4 *)
              ((ulong)(((uint)uVar30 & 1) + ((uint)(uVar30 >> 2) & 0x3fffffff) +
                      (uint)(((uint)uVar30 >> 1 & 1) != 0)) * sVar5 * sVar6 + (long)pvVar7);
    for (uVar15 = 0; (int)(uVar15 | 3) < (int)uVar44; uVar15 = uVar15 + 4) {
      puVar14 = puVar42;
      for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
        puVar40 = puVar14;
        for (lVar29 = 0; (int)lVar29 != 0x10; lVar29 = lVar29 + 4) {
          *(undefined4 *)((long)puVar43 + lVar29) = *puVar40;
          puVar40 = puVar40 + lVar27;
        }
        puVar43 = (undefined4 *)((long)puVar43 + lVar29);
        puVar14 = puVar14 + 1;
      }
      puVar42 = puVar42 + (int)(uVar3 * 4);
      lVar34 = lVar34 + lVar16;
    }
    for (; (int)(uVar15 | 1) < (int)uVar44; uVar15 = uVar15 + 2) {
      for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        *puVar43 = puVar42[uVar11];
        puVar43[1] = *(undefined4 *)(lVar34 + uVar11 * 4);
        puVar43 = puVar43 + 2;
      }
      puVar42 = puVar42 + lVar10;
      lVar34 = lVar34 + lVar1;
    }
    for (; (int)uVar15 < (int)uVar44; uVar15 = uVar15 + 1) {
      for (lVar34 = 0; lVar2 != lVar34; lVar34 = lVar34 + 4) {
        *(undefined4 *)((long)puVar43 + lVar34) = *(undefined4 *)((long)puVar42 + lVar34);
      }
      puVar43 = (undefined4 *)((long)puVar43 + lVar34);
    }
    iVar26 = iVar26 + uVar3 * uVar44;
  }
  if (opt->lightmode == true) {
    piVar8 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        pAVar9 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar9 == (Allocator *)0x0) {
          free((this->super_Convolution1D).weight_data.data);
        }
        else {
          (*pAVar9->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}